

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

string_t * __thiscall
pugi::xml_node::path_abi_cxx11_(string_t *__return_storage_ptr__,xml_node *this,char_t delimiter)

{
  xml_node_struct *pxVar1;
  char_t *__s;
  size_t sVar2;
  xml_node_struct *i;
  xml_node_struct *pxVar3;
  long lVar4;
  bool bVar5;
  
  pxVar1 = this->_root;
  if (pxVar1 == (xml_node_struct *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    lVar4 = 0;
    pxVar3 = pxVar1;
    do {
      bVar5 = pxVar3 != pxVar1;
      if (pxVar3->name == (char_t *)0x0) {
        sVar2 = 0;
      }
      else {
        sVar2 = strlen((char *)pxVar3->name);
      }
      pxVar3 = pxVar3->parent;
      lVar4 = lVar4 + (ulong)bVar5 + sVar2;
    } while (pxVar3 != (xml_node_struct *)0x0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)lVar4);
    for (pxVar1 = this->_root; pxVar1 != (xml_node_struct *)0x0; pxVar1 = pxVar1->parent) {
      if (pxVar1 != this->_root) {
        (__return_storage_ptr__->_M_dataplus)._M_p[lVar4 + -1] = delimiter;
        lVar4 = lVar4 + -1;
      }
      __s = pxVar1->name;
      if (__s != (char_t *)0x0) {
        sVar2 = strlen((char *)__s);
        lVar4 = lVar4 - sVar2;
        memcpy((__return_storage_ptr__->_M_dataplus)._M_p + lVar4,__s,sVar2);
      }
    }
    if (lVar4 != 0) {
      __assert_fail("offset == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x1846,"string_t pugi::xml_node::path(char_t) const");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN string_t xml_node::path(char_t delimiter) const
	{
		if (!_root) return string_t();

		size_t offset = 0;

		for (xml_node_struct* i = _root; i; i = i->parent)
		{
			offset += (i != _root);
			offset += i->name ? impl::strlength(i->name) : 0;
		}

		string_t result;
		result.resize(offset);

		for (xml_node_struct* j = _root; j; j = j->parent)
		{
			if (j != _root)
				result[--offset] = delimiter;

			if (j->name)
			{
				size_t length = impl::strlength(j->name);

				offset -= length;
				memcpy(&result[offset], j->name, length * sizeof(char_t));
			}
		}

		assert(offset == 0);

		return result;
	}